

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

int plot_readownertemplate
              (t_plot *x,t_word *data,t_template *ownertemplate,t_symbol **elemtemplatesymp,
              _array **arrayp,t_float *linewidthp,t_float *xlocp,t_float *xincp,t_float *ylocp,
              t_float *stylep,t_float *visp,t_float *scalarvisp,t_float *editp,_fielddesc **xfield,
              _fielddesc **yfield,_fielddesc **wfield)

{
  undefined8 uVar1;
  int iVar2;
  t_float tVar3;
  _array *array;
  t_symbol *elemtemplatesym;
  int type;
  int arrayonset;
  t_float *linewidthp_local;
  _array **arrayp_local;
  t_symbol **elemtemplatesymp_local;
  t_template *ownertemplate_local;
  t_word *data_local;
  t_plot *x_local;
  
  _type = linewidthp;
  linewidthp_local = (t_float *)arrayp;
  arrayp_local = (_array **)elemtemplatesymp;
  elemtemplatesymp_local = (t_symbol **)ownertemplate;
  ownertemplate_local = (t_template *)data;
  data_local = (t_word *)x;
  if (((x->x_data).fd_type == '7') && ((x->x_data).fd_var != '\0')) {
    iVar2 = template_find_field(ownertemplate,(x->x_data).fd_un.fd_symbol,
                                (int *)((long)&elemtemplatesym + 4),(int *)&elemtemplatesym,
                                (t_symbol **)&array);
    if (iVar2 == 0) {
      pd_error((void *)0x0,"plot: %s: no such field",(data_local[0x26].w_symbol)->s_name);
      x_local._4_4_ = -1;
    }
    else if ((int)elemtemplatesym == 3) {
      uVar1 = *(undefined8 *)((long)&ownertemplate_local->t_pdobj + (long)elemtemplatesym._4_4_);
      tVar3 = fielddesc_getfloat((_fielddesc *)(data_local + 0xc),
                                 (t_template *)elemtemplatesymp_local,(t_word *)ownertemplate_local,
                                 1);
      *_type = tVar3;
      tVar3 = fielddesc_getfloat((_fielddesc *)(data_local + 0x11),
                                 (t_template *)elemtemplatesymp_local,(t_word *)ownertemplate_local,
                                 1);
      *xlocp = tVar3;
      tVar3 = fielddesc_getfloat((_fielddesc *)(data_local + 0x1b),
                                 (t_template *)elemtemplatesymp_local,(t_word *)ownertemplate_local,
                                 1);
      *xincp = tVar3;
      tVar3 = fielddesc_getfloat((_fielddesc *)(data_local + 0x16),
                                 (t_template *)elemtemplatesymp_local,(t_word *)ownertemplate_local,
                                 1);
      *ylocp = tVar3;
      tVar3 = fielddesc_getfloat((_fielddesc *)(data_local + 0x20),
                                 (t_template *)elemtemplatesymp_local,(t_word *)ownertemplate_local,
                                 1);
      *stylep = tVar3;
      tVar3 = fielddesc_getfloat((_fielddesc *)(data_local + 0x39),
                                 (t_template *)elemtemplatesymp_local,(t_word *)ownertemplate_local,
                                 1);
      *visp = tVar3;
      tVar3 = fielddesc_getfloat((_fielddesc *)(data_local + 0x3e),
                                 (t_template *)elemtemplatesymp_local,(t_word *)ownertemplate_local,
                                 1);
      *scalarvisp = tVar3;
      tVar3 = fielddesc_getfloat((_fielddesc *)(data_local + 0x43),
                                 (t_template *)elemtemplatesymp_local,(t_word *)ownertemplate_local,
                                 1);
      *editp = tVar3;
      *arrayp_local = array;
      *(undefined8 *)linewidthp_local = uVar1;
      *xfield = (_fielddesc *)(data_local + 0x2a);
      *yfield = (_fielddesc *)(data_local + 0x2f);
      *wfield = (_fielddesc *)(data_local + 0x34);
      x_local._4_4_ = 0;
    }
    else {
      pd_error((void *)0x0,"plot: %s: not an array",(data_local[0x26].w_symbol)->s_name);
      x_local._4_4_ = -1;
    }
  }
  else {
    pd_error((void *)0x0,"plot: needs an array field");
    x_local._4_4_ = -1;
  }
  return x_local._4_4_;
}

Assistant:

static int plot_readownertemplate(t_plot *x,
    t_word *data, t_template *ownertemplate,
    t_symbol **elemtemplatesymp, t_array **arrayp,
    t_float *linewidthp, t_float *xlocp, t_float *xincp, t_float *ylocp,
    t_float *stylep, t_float *visp, t_float *scalarvisp, t_float *editp,
    t_fielddesc **xfield, t_fielddesc **yfield, t_fielddesc **wfield)
{
    int arrayonset, type;
    t_symbol *elemtemplatesym;
    t_array *array;

        /* find the data and verify it's an array */
    if (x->x_data.fd_type != A_ARRAY || !x->x_data.fd_var)
    {
        pd_error(0, "plot: needs an array field");
        return (-1);
    }
    if (!template_find_field(ownertemplate, x->x_data.fd_un.fd_varsym,
        &arrayonset, &type, &elemtemplatesym))
    {
        pd_error(0, "plot: %s: no such field", x->x_data.fd_un.fd_varsym->s_name);
        return (-1);
    }
    if (type != DT_ARRAY)
    {
        pd_error(0, "plot: %s: not an array", x->x_data.fd_un.fd_varsym->s_name);
        return (-1);
    }
    array = *(t_array **)(((char *)data) + arrayonset);
    *linewidthp = fielddesc_getfloat(&x->x_width, ownertemplate, data, 1);
    *xlocp = fielddesc_getfloat(&x->x_xloc, ownertemplate, data, 1);
    *xincp = fielddesc_getfloat(&x->x_xinc, ownertemplate, data, 1);
    *ylocp = fielddesc_getfloat(&x->x_yloc, ownertemplate, data, 1);
    *stylep = fielddesc_getfloat(&x->x_style, ownertemplate, data, 1);
    *visp = fielddesc_getfloat(&x->x_vis, ownertemplate, data, 1);
    *scalarvisp = fielddesc_getfloat(&x->x_scalarvis, ownertemplate, data, 1);
    *editp = fielddesc_getfloat(&x->x_edit, ownertemplate, data, 1);
    *elemtemplatesymp = elemtemplatesym;
    *arrayp = array;
    *xfield = &x->x_xpoints;
    *yfield = &x->x_ypoints;
    *wfield = &x->x_wpoints;
    return (0);
}